

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFields
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *provided)

{
  bool bVar1;
  FileDescriptor *file;
  const_reference ppFVar2;
  GeneratorOptions *options_00;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  FieldDescriptor *field;
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provided_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  for (field._4_4_ = 0;
      file = (FileDescriptor *)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size(fields), (FileDescriptor *)(long)field._4_4_ < file;
      field._4_4_ = field._4_4_ + 1) {
    ppFVar2 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](fields,(long)field._4_4_);
    name.field_2._8_8_ = *ppFVar2;
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)name.field_2._8_8_);
    if (!bVar1) {
      options_00 = (GeneratorOptions *)FieldDescriptor::file((FieldDescriptor *)name.field_2._8_8_);
      (anonymous_namespace)::GetFilePath_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)options,options_00,file);
      std::operator+(&local_80,&local_a0,".");
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)name.field_2._8_8_,
                 (FieldDescriptor *)file);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(provided,(value_type *)local_60);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  return;
}

Assistant:

void Generator::FindProvidesForFields(
    const GeneratorOptions& options,
    io::Printer* printer,
    const std::vector<const FieldDescriptor*>& fields,
    std::set<string>* provided) const {
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (IgnoreField(field)) {
      continue;
    }

    string name = GetFilePath(options, field->file()) + "." +
                  JSObjectFieldName(options, field);
    provided->insert(name);
  }
}